

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

void __thiscall
nlohmann::detail::input_stream_adapter::input_stream_adapter(input_stream_adapter *this,istream *i)

{
  int_type iVar1;
  int iVar2;
  
  (this->super_input_adapter_protocol)._vptr_input_adapter_protocol =
       (_func_int **)&PTR_get_character_001b4518;
  this->is = i;
  this->sb = *(streambuf **)(i + *(long *)(*(long *)i + -0x18) + 0xe8);
  iVar1 = get_character(this);
  if (iVar1 == -1) {
    return;
  }
  if (iVar1 == 0xef) {
    iVar2 = (**(this->super_input_adapter_protocol)._vptr_input_adapter_protocol)(this);
    if (iVar2 != -1) {
      if (iVar2 == 0xbb) {
        iVar2 = (**(this->super_input_adapter_protocol)._vptr_input_adapter_protocol)(this);
        if (iVar2 != -1) {
          if (iVar2 == 0xbf) {
            return;
          }
          std::istream::unget();
        }
        std::istream::putback((char)this->is);
      }
      else {
        std::istream::unget();
      }
    }
    std::istream::putback((char)this->is);
    return;
  }
  std::istream::unget();
  return;
}

Assistant:

explicit input_stream_adapter(std::istream& i)
: is(i), sb(*i.rdbuf())
{
// skip byte order mark
std::char_traits<char>::int_type c;
if ((c = get_character()) == 0xEF)
{
if ((c = get_character()) == 0xBB)
{
if ((c = get_character()) == 0xBF)
{
return; // Ignore BOM
}
else if (c != std::char_traits<char>::eof())
{
is.unget();
}
is.putback('\xBB');
}
else if (c != std::char_traits<char>::eof())
{
is.unget();
}
is.putback('\xEF');
}
else if (c != std::char_traits<char>::eof())
{
is.unget(); // no byte order mark; process as usual
}
}